

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>,_2048UL,_2048UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *phVar2;
  undefined8 uVar3;
  void *pvVar4;
  ulong uVar5;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar5 = (ulong)&stack0xffffffffffffffe0 & 0xfffffffffffff800;
  *(undefined8 *)(uVar5 - 0x1808) = 0x10040cb;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0x10040de;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::start_reentrant_push<density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1020),
             (conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
              *)i_queue,(TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  this = (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar5 - 0x1020);
  pcVar1 = this->m_queue;
  phVar2 = *(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             **)(uVar5 - 0x1018);
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)(uVar5 - 0x1040) = pcVar1;
  *(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> **)
   (uVar5 - 0x1038) = phVar2;
  uVar3 = *(undefined8 *)(uVar5 - 0x1008);
  *(undefined8 *)(uVar5 - 0x1030) = *(undefined8 *)(uVar5 - 0x1010);
  *(undefined8 *)(uVar5 - 0x1028) = uVar3;
  this->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  *(undefined8 *)(uVar5 - 0x1018) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0x1004114;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this);
  *(undefined8 *)(uVar5 - 0x1808) = 0x1004121;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar5 - 0x1000));
  *(undefined8 *)(uVar5 - 0x1808) = 0x1004126;
  exception_checkpoint();
  __return_storage_ptr__->m_queue = pcVar1;
  (__return_storage_ptr__->m_put_transaction).m_queue = phVar2;
  pvVar4 = *(void **)(uVar5 - 0x1028);
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       *(ControlBlock **)(uVar5 - 0x1030);
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage = pvVar4;
  *(undefined8 *)(uVar5 - 0x1040) = 0;
  *(undefined8 *)(uVar5 - 0x1038) = 0;
  *(undefined8 *)(uVar5 - 0x1808) = 0x1004150;
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar5 - 0x1040));
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }